

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.hh
# Opt level: O1

PcodeOp * RuleDoubleLoad::noWriteConflict(PcodeOp *op1,PcodeOp *op2,AddrSpace *spc)

{
  int iVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  PcodeOp *pPVar4;
  
  if (op1->parent == op2->parent) {
    pPVar4 = op1;
    if ((op2->start).order < (op1->start).order) {
      pPVar4 = op2;
      op2 = op1;
    }
    p_Var3 = ((pPVar4->basiciter)._M_node)->_M_next;
    do {
      while( true ) {
        if (p_Var3 == (op2->basiciter)._M_node) {
          return op2;
        }
        p_Var2 = p_Var3[1]._M_next;
        p_Var3 = p_Var3->_M_next;
        iVar1 = *(int *)&p_Var2->_M_next[1]._M_next;
        if (iVar1 == 3) break;
        if (iVar1 - 4U < 7) {
          return (PcodeOp *)0x0;
        }
        if ((p_Var2[4]._M_prev != (_List_node_base *)0x0) &&
           ((AddrSpace *)p_Var2[4]._M_prev[1]._M_next == spc)) {
          return (PcodeOp *)0x0;
        }
      }
    } while ((AddrSpace *)(p_Var2[5]._M_next)->_M_next[1]._M_prev != spc);
  }
  return (PcodeOp *)0x0;
}

Assistant:

const Address &getAddr(void) const { return start.getAddr(); }